

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_lookupSelector(sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_globalLookupCacheEntry_t *psVar3;
  sysbvm_tuple_t method;
  sysbvm_globalLookupCacheEntry_t *cacheEntry;
  size_t cacheEntryIndex;
  sysbvm_tuple_t selector_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isDummyValue(type);
    if (_Var1) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      sVar2 = computeLookupCacheEntryIndexFor(type,selector);
      psVar3 = (context->roots).globalMethodLookupCache + sVar2;
      if ((psVar3->type == type) && (psVar3->selector == selector)) {
        context_local = (sysbvm_context_t *)psVar3->method;
      }
      else {
        context_local =
             (sysbvm_context_t *)sysbvm_type_lookupSelectorRecursively(context,type,selector);
        if (context_local != (sysbvm_context_t *)0x0) {
          psVar3->type = type;
          psVar3->selector = selector;
          psVar3->method = (sysbvm_tuple_t)context_local;
        }
      }
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;

    // FIXME: Make this cache atomic and thread safe.
    size_t cacheEntryIndex = computeLookupCacheEntryIndexFor(type, selector);
    sysbvm_globalLookupCacheEntry_t *cacheEntry = context->roots.globalMethodLookupCache + cacheEntryIndex;
    if(cacheEntry->type != type || cacheEntry->selector != selector)
    {
        sysbvm_tuple_t method = sysbvm_type_lookupSelectorRecursively(context, type, selector);
        if(method)
        {
            cacheEntry->type = type;
            cacheEntry->selector = selector;
            cacheEntry->method = method;
        }
        return method;
    }
    else
    {
        return cacheEntry->method;
    }
}